

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

WriteNLResult *
mp::WriteNLFile<mp::NLFeeder_Easy>
          (WriteNLResult *__return_storage_ptr__,string *namebase,NLFeeder_Easy *nlf,NLUtils *utl)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  undefined8 *puVar4;
  int *piVar5;
  undefined8 *puVar6;
  byte bVar7;
  NLHeader in_stack_fffffffffffffc38;
  NLW2_WriteNLResultCode local_2ac;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> writer;
  undefined8 local_140 [21];
  undefined4 local_98;
  int local_94 [25];
  
  bVar7 = 0;
  iVar1 = (nlf->header_).super_NLInfo.super_NLInfo_C.format;
  piVar3 = &(nlf->header_).super_NLInfo.super_NLInfo_C.num_ampl_options;
  if (iVar1 == 0) {
    memcpy(local_140,&nlf->header_,0xa8);
    local_98 = 0;
    piVar5 = local_94;
    for (lVar2 = 0x19; lVar2 != 0; lVar2 = lVar2 + -1) {
      *piVar5 = *piVar3;
      piVar3 = piVar3 + (ulong)bVar7 * -2 + 1;
      piVar5 = piVar5 + (ulong)bVar7 * -2 + 1;
    }
    puVar4 = local_140;
    puVar6 = (undefined8 *)&stack0xfffffffffffffc38;
    for (lVar2 = 0x22; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar6 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::NLWriter2
              (&writer,nlf,in_stack_fffffffffffffc38,utl);
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::WriteFiles
              (__return_storage_ptr__,&writer,namebase);
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::~NLWriter2(&writer);
  }
  else {
    memcpy(&writer.feeder_,&nlf->header_,0xa8);
    piVar5 = (int *)&writer.header_.super_NLProblemInfo.super_NLProblemInfo_C.field_0xa4;
    for (lVar2 = 0x19; lVar2 != 0; lVar2 = lVar2 + -1) {
      *piVar5 = *piVar3;
      piVar3 = piVar3 + (ulong)bVar7 * -2 + 1;
      piVar5 = piVar5 + (ulong)bVar7 * -2 + 1;
    }
    writer.header_.super_NLInfo.super_NLInfo_C.flags = 0;
    writer.num_vars_and_exprs_ = 0;
    writer.maxLen_ColName_ = 0;
    writer.maxLen_UnvName_ = 0;
    writer.maxLen_FixName_ = 0;
    local_2ac = NLW2_WriteNL_Unset;
    writer.super_FormatterType.utils_ = utl;
    writer.super_FormatterType._8_8_ = nlf;
    writer.header_.super_NLProblemInfo.super_NLProblemInfo_C.num_common_exprs_in_single_objs = iVar1
    ;
    std::
    pair<NLW2_WriteNLResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<NLW2_WriteNLResultCode,_const_char_(&)[1],_true>
              ((pair<NLW2_WriteNLResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&writer.nm,&local_2ac,(char (*) [1])0x1195e4);
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteFiles
              (__return_storage_ptr__,
               (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)&writer,
               namebase);
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::~NLWriter2
              ((NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)&writer);
  }
  return __return_storage_ptr__;
}

Assistant:

inline WriteNLResult WriteNLFile(
    const std::string& namebase,
    NLFeeder& nlf, NLUtils& utl) {
  auto h = nlf.Header();
  if (NLHeader::TEXT == h.format) {
    mp::NLWriter2<
        mp::NLWriter2Params<
        mp::TextFormatter, NLFeeder > >
        writer(nlf, h, utl);
    return writer.WriteFiles(namebase);
  } else {
    mp::NLWriter2<
        mp::NLWriter2Params<
        mp::BinaryFormatter, NLFeeder > >
        writer(nlf, h, utl);
    return writer.WriteFiles(namebase);
  }
}